

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O0

void RunAll2(string *f1)

{
  pointer *ppdVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  int row;
  bool bVar3;
  CSR *this;
  Matrix *pMVar4;
  TriangularSolve *pTVar5;
  iterator iVar6;
  iterator iVar7;
  ostream *poVar8;
  CSC *this_00;
  TriangularSolve *this_01;
  reference pdVar9;
  double x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  rep_conflict local_390;
  double durationSym2;
  rep_conflict local_380;
  rep_conflict local_378;
  Matrix *local_370;
  Matrix *result3;
  int local_35c;
  TriangularSolve *pTStack_358;
  int i_1;
  TriangularSolve *ccs;
  Matrix *ccr;
  CSC *cc;
  double x;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  rep_conflict local_310;
  double durationSym1;
  rep_conflict local_300;
  rep_conflict local_2f8;
  Matrix *local_2f0;
  Matrix *result2;
  int local_2dc;
  duration<double,_std::ratio<1L,_1L>_> dStack_2d8;
  int i;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  TriangularSolve *rs2;
  string local_2b0;
  Matrix *local_290;
  Matrix *v;
  CSR *ccf;
  CSC *H;
  ifstream fin;
  string local_60 [8];
  string in_path_;
  vector<double,_std::allocator<double>_> t2;
  vector<double,_std::allocator<double>_> t1;
  string *f1_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)((long)&in_path_.field_2 + 8));
  std::__cxx11::string::string(local_60,(string *)f1);
  std::ifstream::ifstream(&H,local_60,_S_in);
  format::read_mtx_csc_real((ifstream *)&H,(CSC **)&ccf,true);
  this = (CSR *)operator_new(0x30);
  CSR::CSR(this,ccf->nonzero,ccf->row,*(int *)&ccf->val,ccf->idx,ccf->nzRow,*(double **)(ccf + 1));
  v = (Matrix *)this;
  CSR::turntoCSR(this);
  pMVar4 = (Matrix *)operator_new(0x30);
  rs2._6_1_ = 1;
  row = ccf->nonzero;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"vector:",(allocator *)((long)&rs2 + 7));
  Matrix::Matrix(pMVar4,row,1,&local_2b0);
  rs2._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rs2 + 7));
  local_290 = pMVar4;
  Matrix::Random(pMVar4);
  pTVar5 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(pTVar5,ccf->nonzero);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&end);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&elapsed_seconds);
  for (local_2dc = 0; local_2dc < 5; local_2dc = local_2dc + 1) {
    result2 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result2;
    local_2f0 = TriangularSolve::solve(pTVar5,(CSR *)v,local_290);
    local_2f8 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_2f8;
    durationSym1 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_300,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym1);
    dStack_2d8.__r = local_300;
    local_310 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffd28);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_310);
    pMVar4 = local_2f0;
    if (local_2f0 != (Matrix *)0x0) {
      Matrix::~Matrix(local_2f0);
      operator_delete(pMVar4,0x30);
    }
  }
  ppdVar1 = &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar6 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  iVar7 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)ppdVar1);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar6._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar7._M_current);
  poVar8 = std::operator<<((ostream *)&std::cout,"Solve(CSR)");
  std::operator<<(poVar8,",");
  ppdVar1 = &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  __end1 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)ppdVar1);
  x = (double)std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)ppdVar1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&x);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    cc = (CSC *)*pdVar9;
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(double)cc);
    std::operator<<(poVar8," ,");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  this_00 = (CSC *)operator_new(0x30);
  CSC::CSC(this_00,ccf->nonzero,ccf->row,*(int *)&ccf->val,ccf->idx,ccf->nzRow,*(double **)(ccf + 1)
          );
  ccr = (Matrix *)this_00;
  ccs = (TriangularSolve *)CSC::cscMult(this_00,local_290);
  this_01 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(this_01,ccf->nonzero);
  pTStack_358 = this_01;
  for (local_35c = 0; local_35c < 5; local_35c = local_35c + 1) {
    result3 = (Matrix *)std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)result3;
    local_370 = TriangularSolve::solve(pTStack_358,(CSC *)ccr,local_290);
    local_378 = (rep_conflict)std::chrono::_V2::system_clock::now();
    elapsed_seconds.__r = local_378;
    durationSym2 = (double)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&elapsed_seconds,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_380,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym2);
    dStack_2d8.__r = local_380;
    local_390 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&stack0xfffffffffffffd28);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)((long)&in_path_.field_2 + 8),&local_390);
    pMVar4 = local_370;
    if (local_370 != (Matrix *)0x0) {
      Matrix::~Matrix(local_370);
      operator_delete(pMVar4,0x30);
    }
  }
  pvVar2 = (vector<double,_std::allocator<double>_> *)((long)&in_path_.field_2 + 8);
  iVar6 = std::vector<double,_std::allocator<double>_>::begin(pvVar2);
  iVar7 = std::vector<double,_std::allocator<double>_>::end(pvVar2);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar6._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar7._M_current);
  poVar8 = std::operator<<((ostream *)&std::cout,"Solve(CSC)");
  std::operator<<(poVar8,",");
  pvVar2 = (vector<double,_std::allocator<double>_> *)((long)&in_path_.field_2 + 8);
  __end1_1 = std::vector<double,_std::allocator<double>_>::begin(pvVar2);
  x_1 = (double)std::vector<double,_std::allocator<double>_>::end(pvVar2);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&x_1);
    if (!bVar3) break;
    pdVar9 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1_1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pdVar9);
    std::operator<<(poVar8," ,");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  if (ccf != (CSR *)0x0) {
    format::CSC::~CSC((CSC *)ccf);
    operator_delete(ccf,0x38);
  }
  pMVar4 = v;
  if (v != (Matrix *)0x0) {
    CSR::~CSR((CSR *)v);
    operator_delete(pMVar4,0x30);
  }
  pMVar4 = local_290;
  if (local_290 != (Matrix *)0x0) {
    Matrix::~Matrix(local_290);
    operator_delete(pMVar4,0x30);
  }
  if (pTVar5 != (TriangularSolve *)0x0) {
    TriangularSolve::~TriangularSolve(pTVar5);
    operator_delete(pTVar5,4);
  }
  pMVar4 = ccr;
  if (ccr != (Matrix *)0x0) {
    CSC::~CSC((CSC *)ccr);
    operator_delete(pMVar4,0x30);
  }
  pTVar5 = ccs;
  if (ccs != (TriangularSolve *)0x0) {
    Matrix::~Matrix((Matrix *)ccs);
    operator_delete(pTVar5,0x30);
  }
  pTVar5 = pTStack_358;
  if (pTStack_358 != (TriangularSolve *)0x0) {
    TriangularSolve::~TriangularSolve(pTStack_358);
    operator_delete(pTVar5,4);
  }
  std::ifstream::~ifstream(&H);
  std::__cxx11::string::~string(local_60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)((long)&in_path_.field_2 + 8));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  return;
}

Assistant:

void  RunAll2(string f1)
{
    vector<double> t1;
    vector<double> t2;
    //CSR
    std::string in_path_ = f1;
    std::ifstream fin(in_path_);
    format::CSC *H;
    read_mtx_csc_real(fin, H, true);

    //print of csc file
    CSR *ccf = new CSR(H->n, H->m, H->nnz, H->p, H->i, H->x);
    //ccf->triplet();

    //turn to csr
    // cout<<"CSR:"<<"\n";
    ccf->turntoCSR();
    // ccf->triplet();

    //csc file Solve
    Matrix *v = new Matrix(H->n,1,"vector:");
    v->Random();
    // v->print();
    TriangularSolve *rs2 = new TriangularSolve(H->n);
    //time
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
          Matrix *result2 = rs2->solve( ccf, v);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym1 = elapsed_seconds.count();
        t1.push_back(durationSym1);
        // cout << "execution time (CSR Solve):" << durationSym1 << "\n";
        //result2->print();
        delete result2;
    }
    sort(t1.begin(), t1.end());
    cout << "Solve(CSR)"<<",";
    for (auto x : t1)
        cout << x << " ,";
    cout<<"\n";

    // csr Solve,Test the equation(ccf*y=rhcr)
    //  Matrix *rs3 = ccf->csrMult(result2);
    //  rs3->print();
    //bool r2 = rs3->isequal(v);
    // cout<<"the result of Triangular solve is(CSR): "<<r2 <<"\n";

    //multiply of csc(file) and vector(file)
    //Matrix *mf = cf->turnToRegular();
    // mf->print();
    //Matrix *vf = cf->csrMult();
    //  vf->print();


    //CSC

    // std::string in_path_ = f1 ;
    //  std::ifstream fin(in_path_);
    //  format::CSC *H;
    //  read_mtx_csc_real(fin, H, true);

    //  csc print file

    CSC *cc = new CSC(H->n, H->m, H->nnz, H->p, H->i, H->x);
    // cc->Triplet();
    Matrix *ccr = cc->cscMult(v);

    // ccr->print();

    //csc Solve
    TriangularSolve *ccs = new TriangularSolve(H->n);
    //time
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
          Matrix *result3 = ccs->solve(cc,v);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym2 = elapsed_seconds.count();
        t2.push_back(durationSym2);
        // result3->print();
        delete result3;
    }
    sort(t2.begin(), t2.end());
    cout << "Solve(CSC)"<<",";
    for (auto x : t2)
        cout << x << " ,";
    cout<<"\n";

    //PRINT All
    //cout<<"csr"<<","<<"csc"<<","<<"\n";
    // cout << durationSym1<<"," << durationSym2 << "\n";
    //cout<<"csc (solve):"<<"\n";
    // cout<<"print mcc again";


    //csc Solve,Test
    // Matrix *mcc2 = cc->cscMult(result3);
    //  mcc2->print();
    //  bool r3 = v->isequal(mcc2);
    // cout<<"the result of testing Triangular solve  (CSC) is: "<<r2 <<"\n";

    delete H;
    delete ccf;
    delete v;
    delete rs2;
    // delete result2;
    // delete rs3;
    //CSC
    delete cc;
    delete ccr;
    delete ccs;
    // delete result3;
    //  delete mcc2;


}